

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (Option *this,vector<long,_std::allocator<long>_> *target,string_view name,
          string_view value)

{
  string *in_RDI;
  vector<long,_std::allocator<long>_> *in_stack_000000c0;
  bitmask<slang::CommandLineFlags> in_stack_000000cc;
  undefined1 in_stack_000000d0 [16];
  undefined1 in_stack_000000e0 [16];
  
  setIntList<long>(in_stack_000000c0,(string_view)in_stack_000000e0,(string_view)in_stack_000000d0,
                   in_stack_000000cc);
  return in_RDI;
}

Assistant:

std::string CommandLine::Option::set(std::vector<int64_t>& target, std::string_view name,
                                     std::string_view value) {
    return setIntList(target, name, value, flags);
}